

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_profile_stop(lua_State *L)

{
  uint uVar1;
  ulong uVar2;
  TValue *pTVar3;
  long in_RDI;
  TValue key;
  GCtab *registry;
  GCobj *o;
  lua_State *in_stack_ffffffffffffffd8;
  cTValue *in_stack_ffffffffffffffe8;
  GCtab *in_stack_fffffffffffffff0;
  lua_State *in_stack_fffffffffffffff8;
  
  luaJIT_profile_stop(in_stack_ffffffffffffffd8);
  uVar2 = (ulong)*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x118);
  pTVar3 = lj_tab_set(in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8)
  ;
  (pTVar3->field_2).it = 0xffffffff;
  pTVar3 = lj_tab_set(in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8)
  ;
  (pTVar3->field_2).it = 0xffffffff;
  if ((*(byte *)(uVar2 + 4) & 4) != 0) {
    uVar1 = *(uint *)(in_RDI + 8);
    *(byte *)(uVar2 + 4) = *(byte *)(uVar2 + 4) & 0xfb;
    *(undefined4 *)(uVar2 + 0xc) = *(undefined4 *)((ulong)uVar1 + 0x6c);
    *(int *)((ulong)uVar1 + 0x6c) = (int)uVar2;
  }
  return 0;
}

Assistant:

LJLIB_CF(jit_profile_stop)
{
  GCtab *registry;
  TValue key;
  luaJIT_profile_stop(L);
  registry = tabV(registry(L));
  key.u64 = KEY_PROFILE_THREAD;
  setnilV(lj_tab_set(L, registry, &key));
  key.u64 = KEY_PROFILE_FUNC;
  setnilV(lj_tab_set(L, registry, &key));
  lj_gc_anybarriert(L, registry);
  return 0;
}